

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

void page_release(bfy_page *page)

{
  _Bool _Var1;
  bfy_page *page_local;
  
  if (page->unref_cb != (bfy_unref_cb *)0x0) {
    (*page->unref_cb)(page->data,page->size,page->unref_arg);
  }
  _Var1 = page_can_realloc(page);
  if (_Var1) {
    page_realloc(page,0);
  }
  memcpy(page,&InitPage,0x38);
  return;
}

Assistant:

static void
page_release(struct bfy_page* page) {
    if (page->unref_cb != NULL) {
        page->unref_cb(page->data, page->size, page->unref_arg);
    }
    if (page_can_realloc(page)) {
        page_realloc(page, 0);
    }
    *page = InitPage;
}